

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O0

DispatchCallResult __thiscall
capnp::Capability::Server::internalUnimplemented
          (Server *this,char *interfaceName,uint64_t typeId,uint16_t methodId)

{
  undefined6 in_register_0000000a;
  undefined8 extraout_RDX;
  DispatchCallResult DVar1;
  PromiseBase PVar2;
  String local_1d8;
  Exception local_1c0;
  undefined1 local_2a [2];
  char *pcStack_28;
  uint16_t methodId_local;
  uint64_t typeId_local;
  char *interfaceName_local;
  Server *this_local;
  
  pcStack_28 = (char *)CONCAT62(in_register_0000000a,methodId);
  PVar2.node.ptr = (OwnPromiseNode)(OwnPromiseNode)this;
  typeId_local = typeId;
  interfaceName_local = interfaceName;
  this_local = this;
  kj::_::Debug::makeDescription<char_const(&)[24],char_const*&,unsigned_long&,unsigned_short&>
            (&local_1d8,(Debug *)"\"Method not implemented.\", interfaceName, typeId, methodId",
             "Method not implemented.",(char (*) [24])&typeId_local,&stack0xffffffffffffffd8,
             (unsigned_long *)local_2a,(unsigned_short *)this);
  kj::Exception::Exception
            (&local_1c0,UNIMPLEMENTED,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability.c++"
             ,100,&local_1d8);
  kj::Promise<void>::Promise((Promise<void> *)this,&local_1c0);
  *(undefined1 *)&(this->thisHook).ptr = 0;
  *(undefined1 *)((long)&(this->thisHook).ptr + 1) = 1;
  kj::Exception::~Exception(&local_1c0);
  kj::String::~String(&local_1d8);
  DVar1.isStreaming = (bool)(char)extraout_RDX;
  DVar1.allowCancellation = (bool)(char)((ulong)extraout_RDX >> 8);
  DVar1._10_6_ = (int6)((ulong)extraout_RDX >> 0x10);
  DVar1.promise.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)PVar2.node.ptr;
  return DVar1;
}

Assistant:

Capability::Server::DispatchCallResult Capability::Server::internalUnimplemented(
    const char* interfaceName, uint64_t typeId, uint16_t methodId) {
  return {
    KJ_EXCEPTION(UNIMPLEMENTED, "Method not implemented.", interfaceName, typeId, methodId),
    false, true
  };
}